

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsInput::matchSum(SmodelsInput *this,RuleBuilder *rule,bool weights)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Atom_t AVar5;
  uint uVar6;
  WeightLit_t *pWVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  long lVar9;
  bool bVar10;
  
  uVar2 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar3 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar4 = ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"unsigned integer expected")
  ;
  uVar6 = uVar4;
  uVar1 = uVar2;
  uVar8 = uVar3;
  if ((int)CONCAT71(in_register_00000011,weights) == 0) {
    uVar6 = uVar3;
    uVar1 = uVar4;
    uVar8 = uVar2;
  }
  RuleBuilder::startSum(rule,uVar1);
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    AVar5 = ProgramReader::matchAtom(&this->super_ProgramReader,"atom expected");
    bVar10 = uVar6 == 0;
    uVar1 = -AVar5;
    uVar6 = uVar6 - 1;
    if (bVar10) {
      uVar1 = AVar5;
      uVar6 = 0;
    }
    RuleBuilder::addGoal(rule,(WeightLit_t)((ulong)uVar1 | 0x100000000));
  }
  if (weights) {
    pWVar7 = RuleBuilder::wlits_begin(rule);
    for (lVar9 = (ulong)uVar3 << 3; lVar9 != 0; lVar9 = lVar9 + -8) {
      uVar6 = ProgramReader::matchPos(&this->super_ProgramReader,"non-negative weight expected");
      pWVar7->weight = uVar6;
      pWVar7 = pWVar7 + 1;
    }
  }
  return;
}

Assistant:

void SmodelsInput::matchSum(RuleBuilder& rule, bool weights) {
	uint32_t bnd = matchPos();
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	if (!weights) { std::swap(len, bnd); std::swap(bnd, neg); }
	rule.startSum(bnd);
	for (uint32_t i = 0; i != len; ++i) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p, 1);
	}
	if (weights) {
		for (WeightLit_t* x = rule.wlits_begin(), *end = x + len; x != end; ++x) {
			x->weight = (Weight_t)matchPos("non-negative weight expected");
		}
	}
}